

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O0

exr_result_t
exr_initialize_required_attr
          (exr_context_t ctxt,int part_index,exr_attr_box2i_t *displayWindow,
          exr_attr_box2i_t *dataWindow,float pixelaspectratio,exr_attr_v2f_t *screenWindowCenter,
          float screenWindowWidth,exr_lineorder_t lineorder,exr_compression_t ctype)

{
  exr_context_t in_RCX;
  undefined8 in_RDX;
  undefined4 in_ESI;
  int in_XMM0_Da;
  exr_result_t rv;
  float in_stack_ffffffffffffffd0;
  int part_index_00;
  undefined4 in_stack_ffffffffffffffe8;
  exr_result_t local_4;
  
  part_index_00 = (int)((ulong)in_RDX >> 0x20);
  local_4 = exr_set_compression(in_RCX,in_XMM0_Da,(exr_compression_t)in_stack_ffffffffffffffd0);
  if ((((local_4 == 0) &&
       (local_4 = exr_set_data_window((exr_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),
                                      part_index_00,(exr_attr_box2i_t *)in_RCX), local_4 == 0)) &&
      (local_4 = exr_set_display_window
                           ((exr_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),part_index_00,
                            (exr_attr_box2i_t *)in_RCX), local_4 == 0)) &&
     (((local_4 = exr_set_lineorder(in_RCX,in_XMM0_Da,(exr_lineorder_t)in_stack_ffffffffffffffd0),
       local_4 == 0 &&
       (local_4 = exr_set_pixel_aspect_ratio(in_RCX,in_XMM0_Da,in_stack_ffffffffffffffd0),
       local_4 == 0)) &&
      (local_4 = exr_set_screen_window_center
                           ((exr_context_t)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),part_index_00,
                            (exr_attr_v2f_t *)in_RCX), local_4 == 0)))) {
    local_4 = exr_set_screen_window_width(in_RCX,in_XMM0_Da,in_stack_ffffffffffffffd0);
  }
  return local_4;
}

Assistant:

exr_result_t
exr_initialize_required_attr (
    exr_context_t           ctxt,
    int                     part_index,
    const exr_attr_box2i_t* displayWindow,
    const exr_attr_box2i_t* dataWindow,
    float                   pixelaspectratio,
    const exr_attr_v2f_t*   screenWindowCenter,
    float                   screenWindowWidth,
    exr_lineorder_t         lineorder,
    exr_compression_t       ctype)
{
    exr_result_t rv;

    rv = exr_set_compression (ctxt, part_index, ctype);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_data_window (ctxt, part_index, dataWindow);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_display_window (ctxt, part_index, displayWindow);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_lineorder (ctxt, part_index, lineorder);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_pixel_aspect_ratio (ctxt, part_index, pixelaspectratio);
    if (rv != EXR_ERR_SUCCESS) return rv;
    rv = exr_set_screen_window_center (ctxt, part_index, screenWindowCenter);
    if (rv != EXR_ERR_SUCCESS) return rv;

    return exr_set_screen_window_width (ctxt, part_index, screenWindowWidth);
}